

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_handler.c
# Opt level: O1

symtype lh_load_sym(soHandle_t h,char *symName)

{
  __int32_t **pp_Var1;
  symtype pvVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  char ucbuf [257];
  char lcbuf [257];
  char ocbuf [257];
  char local_358 [272];
  char local_248 [272];
  char local_138 [264];
  
  iVar8 = 1;
  lVar6 = 0;
  do {
    pcVar5 = symName;
    switch(iVar8) {
    case 2:
      cVar7 = *symName;
      pcVar4 = local_248;
      if (cVar7 != '\0') {
        pp_Var1 = __ctype_tolower_loc();
        pcVar4 = local_248;
        do {
          *pcVar4 = (char)(*pp_Var1)[cVar7];
          pcVar4 = pcVar4 + 1;
          cVar7 = pcVar5[1];
          pcVar5 = pcVar5 + 1;
        } while (cVar7 != '\0');
      }
      lVar6 = (long)pcVar5 - (long)symName;
      *pcVar4 = '_';
      pcVar4 = pcVar4 + 1;
      break;
    case 3:
      cVar7 = *symName;
      pcVar4 = local_358;
      if (cVar7 != '\0') {
        pp_Var1 = __ctype_toupper_loc();
        pcVar4 = local_358;
        pcVar5 = symName + 1;
        do {
          *pcVar4 = (char)(*pp_Var1)[cVar7];
          pcVar4 = pcVar4 + 1;
          cVar7 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar7 != '\0');
      }
      *pcVar4 = '_';
      pcVar4 = pcVar4 + 1;
      goto LAB_001b493b;
    case 4:
      pcVar5 = local_138;
      c_strcpy(pcVar5,symName);
      pcVar4 = local_138 + lVar6 + 1;
      local_138[lVar6] = '_';
      goto LAB_001b4940;
    case 5:
      pcVar4 = local_248 + lVar6;
      break;
    case 6:
      pcVar4 = local_358 + lVar6;
LAB_001b493b:
      pcVar5 = local_358;
      goto LAB_001b4940;
    default:
      goto switchD_001b486a_default;
    }
    pcVar5 = local_248;
LAB_001b4940:
    *pcVar4 = '\0';
switchD_001b486a_default:
    pvVar2 = (symtype)dlsym(h,pcVar5);
    lVar3 = dlerror();
    if (lVar3 == 0) {
      return pvVar2;
    }
    printf("ERROR in %s: ","lh_load_sym");
    printf("Cannot find symbol %s in dynamic library, error = %s",symName,lVar3);
    putchar(10);
    iVar8 = iVar8 + 1;
    if (iVar8 == 7) {
      return (symtype)0x0;
    }
  } while( true );
}

Assistant:

symtype lh_load_sym (soHandle_t h, const char *symName) {
    symtype s;
    const char *from;
    char *to;
    const char *tripSym;
    char* err;
    char lcbuf[257];
    char ucbuf[257];
    char ocbuf[257];
    size_t symLen;
    int trip;

    s = OSQP_NULL;
    err = OSQP_NULL;

    /* search in this order:
     *  1. original
     *  2. lower_
     *  3. upper_
     *  4. original_
     *  5. lower
     *  6. upper
     */

    symLen = 0;
    for (trip = 1;  trip <= 6;  trip++) {
        switch (trip) {
        case 1:                             /* original */
            tripSym = symName;
            break;
        case 2:                             /* lower_ */
            for (from = symName, to = lcbuf;  *from;  from++, to++) {
                *to = tolower(*from);
            }
            symLen = from - symName;
            *to++ = '_';
            *to = '\0';
            tripSym = lcbuf;
            break;
        case 3:                             /* upper_ */
            for (from = symName, to = ucbuf;  *from;  from++, to++) {
                *to = toupper(*from);
            }
            *to++ = '_';
            *to = '\0';
            tripSym = ucbuf;
            break;
        case 4:                             /* original_ */
            c_strcpy(ocbuf, symName);
            ocbuf[symLen] = '_';
            ocbuf[symLen+1] = '\0';
            tripSym = ocbuf;
            break;
        case 5:                             /* lower */
            lcbuf[symLen] = '\0';
            tripSym = lcbuf;
            break;
        case 6:                             /* upper */
            ucbuf[symLen] = '\0';
            tripSym = ucbuf;
            break;
        default:
            tripSym = symName;
        } /* end switch */
#ifdef IS_WINDOWS
        s = GetProcAddress (h, tripSym);
        if (s) {
            return s;
        } else {
            #ifdef PRINTING
            c_eprint("Cannot find symbol %s in dynamic library, error = %d",
                    symName, (int)GetLastError());
            #endif
        }
#else
        s = dlsym (h, tripSym);
        err = dlerror();  /* we have only one chance; a successive call to dlerror() returns OSQP_NULL */
        if (err) {
            #ifdef PRINTING
            c_eprint("Cannot find symbol %s in dynamic library, error = %s",
                    symName, err);
            #endif
        } else {
            return s;
        }
#endif
    } /* end loop over symbol name variations */

    return OSQP_NULL;
}